

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O2

void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *p,int fNew,int iNode1st)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  word *pwVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  int local_8c;
  uint local_88;
  uint local_7c;
  long local_70;
  
  uVar19 = p->nNodes;
  bVar11 = fNew != 0;
  do {
    bVar10 = bVar11;
    iVar12 = p->nNodeMax - uVar19;
    if (iVar12 == 0) {
      if (p->nTops == 1) {
        if (p->fVerbose != 0) {
          Kit_DsdPrintFromTruth((uint *)(p->pTruths + (long)(int)uVar19 + -1),p->nVars);
          uVar19 = p->nVars + 0x61;
          for (lVar25 = (long)p->nVars; lVar25 < p->nNodes; lVar25 = lVar25 + 1) {
            if (p->Polar[lVar25] == 4) {
              printf("  %c=%c+%c",(ulong)uVar19,(ulong)(p->pFans0[lVar25] + 0x61),
                     (ulong)(p->pFans1[lVar25] + 0x61));
            }
            else {
              pcVar18 = "!";
              if (p->fCompl0[lVar25] == 0) {
                pcVar18 = "";
              }
              pcVar23 = "!";
              if (p->fCompl1[lVar25] == 0) {
                pcVar23 = "";
              }
              printf("  %c=%s%c%s%c",(ulong)uVar19,pcVar18,(ulong)(p->pFans0[lVar25] + 0x61),pcVar23
                     ,(ulong)(p->pFans1[lVar25] + 0x61));
            }
            uVar19 = uVar19 + 1;
          }
          putchar(10);
        }
        p->nFinished = p->nFinished + 1;
        return;
      }
      __assert_fail("p->nTops == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                    ,0x23b,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
    }
    if (bVar10) {
      local_70 = 0;
      local_7c = 1;
      iVar14 = iNode1st;
      local_88 = uVar19;
    }
    else {
      iVar14 = p->pFans0[(long)(int)uVar19 + 0xf];
      local_70 = (long)p->pFans0[(long)(int)uVar19 + -1];
      local_7c = p->fCompl1[(long)(int)uVar19 + 0xf] + 1;
      local_88 = iNode1st;
    }
    iVar15 = p->nTops;
    if ((iVar15 < 1) || (iVar12 + 1 < iVar15)) {
      __assert_fail("p->nTops > 0 && p->nTops <= p->nNodeMax - n + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                    ,0x249,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
    }
    iVar12 = p->fUseXor;
    uVar13 = (ulong)uVar19;
    local_8c = (p->nNodeMax - (iVar15 + uVar19)) + 1;
    lVar17 = (long)iVar14;
    iVar14 = p->pLevel[lVar17];
    for (lVar25 = lVar17; lVar25 < (int)local_88; lVar25 = lVar25 + 1) {
      if (local_8c == 0) {
        iVar15 = 0;
        if (p->pRefs[lVar25] < 1) goto LAB_00386e96;
        local_8c = 0;
      }
      else {
        iVar15 = -(uint)(0 < p->pRefs[lVar25]);
LAB_00386e96:
        local_8c = local_8c + iVar15;
        if (local_8c < 0) {
          __assert_fail("nRefedFans >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                        ,0x251,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
        }
        lVar28 = local_70;
        if (lVar25 != lVar17) {
          lVar28 = 0;
        }
        for (; lVar28 < lVar25; lVar28 = lVar28 + 1) {
          if ((local_8c != 0) || (p->pRefs[lVar28] < 1)) {
            iVar15 = (int)lVar28;
            if ((((iVar14 != 0) || ((p->pRefs[lVar28] != 0 || (p->pRefs[lVar25] != 0)))) ||
                ((iVar15 + 1 == (int)lVar25 && ((lVar28 < 1 || (p->Polar[lVar28 + 0xf] != 0)))))) &&
               ((p->pLevel[lVar25] != 0 ||
                ((((p->pRefs[lVar25] != 0 || (lVar25 < 1)) || (p->pRefs[lVar28] == 0)) ||
                 (p->Polar[lVar25 + 0xf] != 0)))))) {
              uVar26 = local_7c;
              if (lVar28 != local_70) {
                uVar26 = 0;
              }
              uVar27 = (ulong)uVar26;
              if (bVar10) {
                uVar27 = 0;
              }
              if (lVar25 != lVar17) {
                uVar27 = 0;
              }
              while (uVar26 = (uint)uVar27, (int)uVar26 < iVar12 + 4) {
                if ((((p->pLevel[lVar28] != 0) || ((uVar27 & 1) == 0)) || (p->pRefs[lVar28] != 0))
                   && (((p->pLevel[lVar25] != 0 || ((uVar27 & 2) == 0)) || (p->pRefs[lVar25] != 0)))
                   ) {
                  p->nTries = p->nTries + 1;
                  p->pFans0[(int)uVar19] = iVar15;
                  p->pFans1[(int)uVar19] = (int)lVar25;
                  p->fCompl0[(int)uVar19] = uVar26 & 1;
                  p->fCompl1[(int)uVar19] = (uint)(uVar27 >> 1) & 1;
                  p->Polar[(int)uVar19] = uVar26;
                  if (uVar26 == 4) {
                    uVar13 = p->pTruths[lVar28] ^ p->pTruths[lVar25];
                  }
                  else {
                    uVar13 = (p->pTruths[lVar28] ^ (long)(int)-(uVar26 & 1)) &
                             ((long)((int)(uVar26 << 0x1e) >> 0x1f) ^ p->pTruths[lVar25]);
                  }
                  p->pTruths[(int)uVar19] = uVar13;
                  uVar20 = p->nNodes;
                  uVar13 = (ulong)(int)uVar20;
                  uVar3 = p->pFans0[uVar13];
                  uVar4 = p->pFans1[uVar13];
                  uVar27 = (ulong)uVar4;
                  if ((int)uVar4 <= (int)uVar3) {
                    __assert_fail("i < k",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                  ,0x20b,"int Abc_EnumerateFilter(Abc_EnuMan_t *)");
                  }
                  uVar6 = p->pTruths[uVar13];
                  if (uVar6 - 1 < 0xfffffffffffffffe) {
                    uVar21 = 0;
                    if (0 < (int)uVar20) {
                      uVar21 = (ulong)uVar20;
                    }
                    uVar22 = 0;
LAB_0038701a:
                    if (uVar21 != uVar22) goto code_r0x0038701f;
                    uVar20 = 0xffffffff;
                    if (-1 < (int)uVar3) {
                      uVar20 = uVar3;
                    }
                    iVar16 = 1;
                    uVar21 = 0;
                    pwVar24 = p->pTruths;
                    while( true ) {
                      pwVar24 = pwVar24 + 1;
                      uVar27 = uVar27 - 1;
                      if (uVar21 == (long)(int)uVar20 + 1U) break;
                      for (uVar22 = 0; iVar16 + (int)uVar22 <= (int)uVar4; uVar22 = uVar22 + 1) {
                        if ((uVar21 != uVar3) || (uVar27 != uVar22)) {
                          uVar7 = p->pTruths[uVar21];
                          uVar8 = pwVar24[uVar22];
                          if (((((uVar6 == (uVar8 & uVar7)) ||
                                ((((uVar8 & uVar7 ^ uVar6) == 0xffffffffffffffff ||
                                  (uVar6 == (~uVar8 & uVar7))) ||
                                 ((~uVar8 & uVar7 ^ uVar6) == 0xffffffffffffffff)))) ||
                               (((uVar6 == (~uVar7 & uVar8) ||
                                 ((~uVar7 & uVar8 ^ uVar6) == 0xffffffffffffffff)) ||
                                (uVar6 == (uVar8 | uVar7))))) ||
                              (((uVar8 | uVar7) ^ uVar6) == 0xffffffffffffffff)) ||
                             ((p->fUseXor != 0 &&
                              ((uVar6 == (uVar8 ^ uVar7) ||
                               ((uVar8 ^ uVar7 ^ uVar6) == 0xffffffffffffffff))))))
                          goto LAB_00387160;
                        }
                      }
                      iVar16 = iVar16 + 1;
                      uVar21 = uVar21 + 1;
                    }
                    p->nBuilds = p->nBuilds + 1;
                    iVar16 = p->pLevel[lVar25];
                    if (p->pLevel[lVar25] < p->pLevel[lVar28]) {
                      iVar16 = p->pLevel[lVar28];
                    }
                    if (iVar14 != iVar16) {
                      __assert_fail("Level == Abc_MaxInt(p->pLevel[i], p->pLevel[k])",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                    ,0x273,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                    }
                    p->pLevel[(int)uVar19] = iVar14 + 1;
                    Abc_EnumRef(p,iVar15);
                    Abc_EnumRef(p,p->pFans1[(int)uVar19]);
                    uVar5 = p->nNodes;
                    uVar9 = p->nTops;
                    p->nNodes = uVar5 + 1;
                    p->nTops = uVar9 + 1;
                    if ((int)uVar5 < (int)uVar19) {
                      __assert_fail("i < p->nNodes",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                    ,0x1de,"void Abc_EnumRefNode(Abc_EnuMan_t *, int)");
                    }
                    Abc_EnumerateFuncs_rec(p,0,local_88);
                    if (p->nNodes <= (int)uVar19) {
                      __assert_fail("i < p->nNodes",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                    ,0x1e2,"void Abc_EnumDerefNode(Abc_EnuMan_t *, int)");
                    }
                    Abc_EnumDeref(p,p->pFans0[(int)uVar19]);
                    Abc_EnumDeref(p,p->pFans1[(int)uVar19]);
                    uVar1 = p->nNodes;
                    uVar2 = p->nTops;
                    p->nNodes = uVar1 - 1;
                    p->nTops = uVar2 + -1;
                    uVar13 = (ulong)uVar19;
                    if (uVar19 != uVar1 - 1) {
                      __assert_fail("n == p->nNodes",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                    ,0x278,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                    }
                  }
                }
LAB_00387160:
                uVar27 = (ulong)(uVar26 + 1);
              }
            }
          }
        }
        local_8c = local_8c + (uint)(0 < p->pRefs[lVar25]);
      }
    }
    uVar19 = (uint)uVar13;
    bVar11 = true;
    if (bVar10) {
      return;
    }
  } while( true );
code_r0x0038701f:
  pwVar24 = p->pTruths + uVar22;
  if ((uVar6 == *pwVar24) || (uVar22 = uVar22 + 1, (*pwVar24 ^ uVar6) == 0xffffffffffffffff))
  goto LAB_00387160;
  goto LAB_0038701a;
}

Assistant:

void Abc_EnumerateFuncs_rec( Abc_EnuMan_t * p, int fNew, int iNode1st ) // the first node on the last level
{
    if ( p->nNodes == p->nNodeMax )
    {
        assert( p->nTops == 1 );
        if ( p->fVerbose )
            Abc_EnumPrintOne( p );
        p->nFinished++;
        return;
    }
    {
    int i, k, c, cLim = 4 + p->fUseXor, n = p->nNodes;
    int nRefedFans = p->nNodeMax - n + 1 - p->nTops;
    int high0 = fNew ? iNode1st : p->pFans1[n-1];
    int high1 = fNew ? n        : iNode1st;
    int low0  = fNew ? 0        : p->pFans0[n-1];
    int c0    = fNew ? 0        : p->Polar[n-1];
    int Level = p->pLevel[high0];
    assert( p->nTops > 0 && p->nTops <= p->nNodeMax - n + 1 );
    // go through nodes 
    for ( k = high0; k < high1; k++ )
    {
        if ( nRefedFans == 0 && p->pRefs[k] > 0 )
            continue;
        if ( p->pRefs[k] > 0 )
            nRefedFans--;
        assert( nRefedFans >= 0 );
        // try second fanin
        for ( i = (k == high0) ? low0 : 0; i < k; i++ )
        {
            if ( nRefedFans == 0 && p->pRefs[i] > 0 )
                continue;
            if ( Level == 0 && p->pRefs[i] == 0 && p->pRefs[k] == 0 && (i+1 != k || (i > 0 && p->pRefs[i-1] == 0)) ) // NPN
                continue;
            if ( p->pLevel[k] == 0 && p->pRefs[k] == 0 && p->pRefs[i] != 0 && k > 0 && p->pRefs[k-1] == 0 ) // NPN
                continue;
//            if ( p->pLevel[i] == 0 && p->pRefs[i] == 0 && p->pRefs[k] != 0 && i > 0 && p->pRefs[i-1] == 0 ) // NPN
//                continue;
            // try four polarities
            for ( c = (k == high0 && i == low0 && !fNew) ? c0 + 1 : 0; c < cLim; c++ )
            {
                if ( p->pLevel[i] == 0 && p->pRefs[i] == 0 && (c & 1) == 1 ) // NPN
                    continue;
                if ( p->pLevel[k] == 0 && p->pRefs[k] == 0 && (c & 2) == 2 ) // NPN
                    continue;
                p->nTries++;
                // create node
                assert( i < k );
                p->pFans0[n]  = i;
                p->pFans1[n]  = k;
                p->fCompl0[n] = c & 1;
                p->fCompl1[n] = (c >> 1) & 1;
                p->Polar[n]   = c;
                if ( c == 4 )
                    p->pTruths[n] = p->pTruths[i] ^ p->pTruths[k];
                else
                    p->pTruths[n] = ((c & 1) ? ~p->pTruths[i] : p->pTruths[i]) & ((c & 2) ? ~p->pTruths[k] : p->pTruths[k]);
                if ( Abc_EnumerateFilter(p) )
                    continue;
                p->nBuilds++;
                assert( Level == Abc_MaxInt(p->pLevel[i], p->pLevel[k]) );
                p->pLevel[n]  = Level + 1;
                Abc_EnumRefNode( p, n );
                Abc_EnumerateFuncs_rec( p, 0, fNew ? n : iNode1st );
                Abc_EnumDerefNode( p, n );
                assert( n == p->nNodes );
            }
        }
        if ( p->pRefs[k] > 0 )
            nRefedFans++;
    }
    if ( fNew )
        return;
    // start a new level
    Abc_EnumerateFuncs_rec( p, 1, iNode1st );
    }
}